

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O1

void init_credits(void)

{
  CREDIT_NAME **ppCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  undefined8 *puVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  CREDIT_NAME *pCVar13;
  int iVar14;
  char *pcVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  undefined1 *puVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  byte *pbVar22;
  int iVar23;
  int iVar24;
  byte *pbVar25;
  CREDIT_NAME **ppCVar26;
  bool bVar27;
  README_SECTION sect [1];
  char buf [256];
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char *local_158;
  char *pcStack_150;
  size_t local_148;
  long local_140;
  byte local_138;
  byte local_137 [263];
  
  text_char = 0xffff;
  text_pix = 0;
  text_scroll = 0;
  cred = (CREDIT_NAME *)0x0;
  credit_width = 0;
  credit_scroll = 0;
  credit_age = 0;
  local_158 = (char *)0x0;
  pcStack_150 = "Introduction";
  local_168 = 0;
  uStack_164 = 0;
  uStack_160 = 0;
  uStack_15c = 0;
  uVar2 = al_ustr_newf("%s/readme.txt",data_path);
  uVar3 = al_cstr(uVar2);
  lVar4 = al_fopen(uVar3,"r");
  al_ustr_free(uVar2);
  if (lVar4 == 0) {
    title_text = "Can\'t find readme.txt, so this scroller is empty.                ";
    title_size = 0x41;
    title_alloced = 0;
  }
  else {
    lVar5 = al_fgets(lVar4,&local_138,0x100);
    if (lVar5 != 0) {
      bVar27 = true;
      puVar17 = (undefined8 *)0x0;
      do {
        bVar19 = local_138;
        if (local_138 == 0x3d) {
          pcVar6 = strchr((char *)&local_138,0x20);
          if (pcVar6 != (char *)0x0) {
            sVar7 = strlen(pcVar6);
            ppuVar8 = __ctype_b_loc();
            iVar14 = (int)sVar7 + -1;
            if ((pcVar6[iVar14] == 0x3d) || (((*ppuVar8)[(byte)pcVar6[iVar14]] & 0x2000) != 0)) {
              pcVar15 = pcVar6 + iVar14;
              iVar14 = (int)sVar7 + -2;
              do {
                do {
                  *pcVar15 = '\0';
                  pcVar15 = pcVar6 + iVar14;
                  lVar5 = (long)iVar14;
                  iVar14 = iVar14 + -1;
                } while (pcVar6[lVar5] == 0x3d);
              } while (((*ppuVar8)[(byte)pcVar6[lVar5]] & 0x2000) != 0);
            }
            iVar14 = my_stricmp(pcVar6 + 1,pcStack_150);
            puVar17 = (undefined8 *)0x0;
            if (iVar14 == 0) {
              puVar17 = (undefined8 *)&local_168;
            }
            bVar27 = true;
          }
        }
        else if (puVar17 == (undefined8 *)0x0) {
          puVar17 = (undefined8 *)0x0;
        }
        else {
          pbVar25 = &local_138;
          if (local_138 != 0) {
            ppuVar8 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar8 + (ulong)bVar19 * 2 + 1) & 0x20) == 0) break;
              bVar19 = pbVar25[1];
              pbVar25 = pbVar25 + 1;
            } while (bVar19 != 0);
          }
          sVar7 = strlen((char *)pbVar25);
          if (-1 < (int)sVar7 + -1) {
            ppuVar8 = __ctype_b_loc();
            do {
              uVar20 = (int)sVar7 - 1;
              sVar7 = (size_t)uVar20;
              if ((*(byte *)((long)*ppuVar8 + (long)(char)pbVar25[sVar7] * 2 + 1) & 0x20) == 0)
              break;
              pbVar25[sVar7] = 0;
            } while (0 < (int)uVar20);
          }
          if ((*pbVar25 != 0) || (!bVar27)) {
            puVar9 = (undefined8 *)malloc(0x10);
            puVar9[1] = 0;
            sVar7 = strlen((char *)pbVar25);
            pcVar6 = (char *)malloc(sVar7 + 1);
            *puVar9 = pcVar6;
            strcpy(pcVar6,(char *)pbVar25);
            puVar16 = (undefined8 *)(puVar17[1] + 8);
            if (puVar17[1] == 0) {
              puVar16 = puVar17;
            }
            *puVar16 = puVar9;
            puVar17[1] = puVar9;
          }
          bVar27 = *pbVar25 == 0;
        }
        lVar5 = al_fgets(lVar4,&local_138,0x100);
      } while (lVar5 != 0);
    }
    al_fclose(lVar4);
    sVar7 = strlen(load_text_intro_msg);
    iVar14 = (int)sVar7;
    puVar17 = (undefined8 *)CONCAT44(uStack_164,local_168);
    title_size = iVar14;
    if (puVar17 != (undefined8 *)0x0) {
      iVar24 = 0;
      puVar16 = puVar17;
      do {
        puVar18 = (undefined1 *)*puVar16;
        if (*puVar18 == '\0') {
          puVar18 = load_text_splitter;
        }
        sVar7 = strlen(puVar18);
        iVar23 = iVar24 + (int)sVar7;
        iVar24 = iVar23 + 1;
        puVar16 = (undefined8 *)puVar16[1];
      } while (puVar16 != (undefined8 *)0x0);
      pcVar6 = (char *)malloc((long)(iVar23 + 2));
      *pcVar6 = '\0';
      puVar16 = puVar17;
      do {
        puVar18 = (undefined1 *)*puVar16;
        if (*puVar18 == '\0') {
          puVar18 = load_text_splitter;
        }
        strcat(pcVar6,puVar18);
        sVar7 = strlen(pcVar6);
        (pcVar6 + sVar7)[0] = ' ';
        (pcVar6 + sVar7)[1] = '\0';
        puVar16 = (undefined8 *)puVar16[1];
      } while (puVar16 != (undefined8 *)0x0);
      local_158 = pcVar6;
      sVar7 = strlen(pcVar6);
      sVar10 = strlen(pcStack_150);
      sVar11 = strlen(load_text_splitter);
      sVar12 = strlen(load_text_marker);
      title_size = (int)sVar11 + (int)sVar7 + (int)sVar10 + (int)sVar12 * 2 + iVar14 + 2;
    }
    pcVar15 = (char *)malloc((long)title_size + 1);
    title_alloced = 1;
    title_text = pcVar15;
    strcpy(pcVar15,load_text_intro_msg);
    pcVar6 = local_158;
    if (local_158 != (char *)0x0) {
      strcat(pcVar15,load_text_marker);
      sVar7 = strlen(pcVar15);
      (pcVar15 + sVar7)[0] = ' ';
      (pcVar15 + sVar7)[1] = '\0';
      strcat(pcVar15,pcStack_150);
      sVar7 = strlen(pcVar15);
      (pcVar15 + sVar7)[0] = ' ';
      (pcVar15 + sVar7)[1] = '\0';
      strcat(pcVar15,load_text_marker);
      strcat(pcVar15,load_text_splitter);
      strcat(pcVar15,pcVar6);
    }
    while (puVar17 != (undefined8 *)0x0) {
      free((void *)*puVar17);
      puVar16 = (undefined8 *)puVar17[1];
      free(puVar17);
      puVar17 = puVar16;
    }
    if (local_158 != (char *)0x0) {
      free(local_158);
    }
  }
  uVar2 = al_ustr_newf("%s/%s",data_path,"thanks.txt");
  uVar3 = al_cstr(uVar2);
  lVar4 = al_fopen(uVar3,"r");
  al_ustr_free(uVar2);
  if (lVar4 != 0) {
    lVar5 = al_fgets(lVar4,&local_138,0x100);
    if (lVar5 != 0) {
      pCVar13 = (CREDIT_NAME *)0x0;
      local_140 = lVar4;
      do {
        iVar14 = my_stricmp((char *)&local_138,"Thanks!");
        if (iVar14 == 0) break;
        while (pcVar6 = strstr((char *)&local_138,"&lt"), pcVar6 != (char *)0x0) {
          *pcVar6 = '<';
          sVar7 = strlen(pcVar6 + 2);
          memmove(pcVar6 + 1,pcVar6 + 3,sVar7);
        }
        while (pcVar6 = strstr((char *)&local_138,"&gt"), pcVar6 != (char *)0x0) {
          *pcVar6 = '>';
          sVar7 = strlen(pcVar6 + 2);
          memmove(pcVar6 + 1,pcVar6 + 3,sVar7);
        }
        uVar21 = (ulong)local_138;
        bVar27 = uVar21 == 0;
        pbVar25 = &local_138;
        if (!bVar27) {
          ppuVar8 = __ctype_b_loc();
          pbVar22 = local_137;
          if ((*(byte *)((long)*ppuVar8 + uVar21 * 2 + 1) & 0x20) == 0) {
            bVar27 = false;
          }
          else {
            do {
              pbVar25 = pbVar22;
              bVar27 = (ulong)*pbVar25 == 0;
              if (bVar27) break;
              pbVar22 = pbVar25 + 1;
            } while ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar25 * 2 + 1) & 0x20) != 0);
          }
        }
        bVar19 = *pbVar25;
        pbVar22 = pbVar25;
        if (bVar19 != 0) {
          ppuVar8 = __ctype_b_loc();
          do {
            if (((*(byte *)((long)*ppuVar8 + (ulong)bVar19 * 2 + 1) & 0x20) != 0) &&
               (pbVar22[1] == 0x28)) break;
            bVar19 = pbVar22[1];
            pbVar22 = pbVar22 + 1;
          } while (bVar19 != 0);
        }
        iVar14 = strncmp((char *)pbVar22," (<email>",9);
        if ((iVar14 == 0) || (iVar14 = strncmp((char *)pbVar22," (email",7), iVar14 == 0)) {
          *pbVar22 = 0;
          pCVar13 = (CREDIT_NAME *)malloc(0x18);
          sVar7 = strlen((char *)pbVar25);
          pcVar6 = (char *)malloc(sVar7 + 1);
          pCVar13->name = pcVar6;
          strcpy(pcVar6,(char *)pbVar25);
          pCVar13->text = (char *)0x0;
          pCVar13->next = credits;
          credits = pCVar13;
        }
        else if ((bool)(bVar27 | pCVar13 == (CREDIT_NAME *)0x0)) {
          pCVar13 = (CREDIT_NAME *)0x0;
        }
        else {
          sVar7 = strlen((char *)pbVar25);
          pbVar22 = pbVar25 + (sVar7 - 1);
          if (pbVar25 < pbVar22) {
            ppuVar8 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar22 * 2 + 1) & 0x20) == 0) break;
              *pbVar22 = 0;
              pbVar22 = pbVar22 + -1;
            } while (pbVar25 < pbVar22);
          }
          pcVar6 = pCVar13->text;
          if (pcVar6 == (char *)0x0) {
            sVar7 = strlen((char *)pbVar25);
            pcVar6 = (char *)malloc(sVar7 + 1);
            pCVar13->text = pcVar6;
            strcpy(pcVar6,(char *)pbVar25);
          }
          else {
            local_148 = strlen(pcVar6);
            sVar7 = strlen((char *)pbVar25);
            pcVar6 = (char *)realloc(pcVar6,local_148 + sVar7 + 2);
            pCVar13->text = pcVar6;
            sVar7 = strlen(pcVar6);
            (pcVar6 + sVar7)[0] = ' ';
            (pcVar6 + sVar7)[1] = '\0';
            strcat(pCVar13->text,(char *)pbVar25);
          }
        }
        lVar4 = local_140;
        lVar5 = al_fgets(local_140,&local_138,0x100);
      } while (lVar5 != 0);
    }
    al_fclose(lVar4);
    if (credits != (CREDIT_NAME *)0x0) {
      bVar27 = true;
      pCVar13 = credits;
      ppCVar26 = &credits;
LAB_001086fa:
      do {
        if (pCVar13->next != (CREDIT_NAME *)0x0) {
          iVar14 = my_stricmp(pCVar13->name,pCVar13->next->name);
          if (0 < iVar14) {
            *ppCVar26 = pCVar13->next;
            pCVar13->next = pCVar13->next->next;
            (*ppCVar26)->next = pCVar13;
            pCVar13 = *ppCVar26;
            bVar27 = false;
          }
          ppCVar1 = &pCVar13->next;
          ppCVar26 = &pCVar13->next;
          pCVar13 = *ppCVar1;
          if (*ppCVar1 != (CREDIT_NAME *)0x0) goto LAB_001086fa;
        }
        if (bVar27) {
          return;
        }
        bVar27 = true;
        pCVar13 = credits;
        ppCVar26 = &credits;
        if (credits == (CREDIT_NAME *)0x0) {
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void init_credits(void)
{
   /* for the text scroller */
   text_char = 0xFFFF;
   text_width = 0;
   text_pix = 0;
   text_scroll = 0;

   /* for the credits display */
   cred = NULL;
   credit_width = 0;
   credit_scroll = 0;
   credit_age = 0;
   credit_speed = 32;
   credit_skip = 1;

   load_text();
   load_credits();
}